

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O1

bool __thiscall CLOptions::ParseCommandLine(CLOptions *this,int argc,char **argv)

{
  pointer pcVar1;
  char *__s;
  undefined1 uVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  CLOptions *this_00;
  _func_int **pp_Var7;
  int option_index;
  string opt_name;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  short_to_long_map;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string short_opts;
  string opt_val;
  int options_index;
  allocator local_199;
  int local_198;
  int local_194;
  char **local_190;
  undefined1 local_188 [32];
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_168;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  string local_118;
  _Base_ptr local_f8;
  _Base_ptr local_f0;
  int local_e8;
  undefined4 uStack_e4;
  undefined1 local_d8 [16];
  undefined1 local_c8 [32];
  int local_a8 [24];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_198 = argc;
  local_190 = argv;
  DefineParams(this);
  if ((this->configfile_opt_name)._M_string_length != 0) {
    local_f8 = (_Base_ptr)&this->configfile_opt_name;
    local_f0 = (_Base_ptr)0x2;
    local_a8[0] = -1;
    iVar4 = getopt_long_only(local_198,local_190,"",
                             (this->longopts).super__Vector_base<option,_std::allocator<option>_>.
                             _M_impl.super__Vector_impl_data._M_start,local_a8);
    if (iVar4 == -1) {
      uVar5 = 3;
    }
    else {
      if (iVar4 == 0) {
        uVar2 = (*(code *)((long)&DAT_0010f020 + (long)(int)(&DAT_0010f020)[(long)local_f0]))();
        return (bool)uVar2;
      }
      std::__cxx11::string::string
                ((string *)&local_168,
                 (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                 super__Vector_impl_data._M_start[local_a8[0]].name,(allocator *)&local_118);
      iVar4 = std::__cxx11::string::compare((string *)&local_168);
      if ((_Base_ptr *)local_168._M_impl._0_8_ !=
          &local_168._M_impl.super__Rb_tree_header._M_header._M_parent) {
        operator_delete((void *)local_168._M_impl._0_8_);
      }
      uVar5 = 0;
      if (iVar4 == 0) {
        std::__cxx11::string::string((string *)&local_168,_optarg,(allocator *)&local_118);
        bVar3 = FillFromFile(this,(string *)&local_168);
        if ((_Base_ptr *)local_168._M_impl._0_8_ !=
            &local_168._M_impl.super__Rb_tree_header._M_header._M_parent) {
          operator_delete((void *)local_168._M_impl._0_8_);
        }
        uVar2 = (*(code *)((long)&DAT_0010f020 + (long)(int)(&DAT_0010f020)[(uint)!bVar3 * 2 + 1]))
                          ();
        return (bool)uVar2;
      }
    }
    uVar2 = (*(code *)((long)&DAT_0010f020 + (long)(int)(&DAT_0010f020)[uVar5]))();
    return (bool)uVar2;
  }
  _optind = 0;
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_local_buf[0] = '\0';
  GetShortOpts((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_168,this,&local_118);
  do {
    pp_Var7 = (_func_int **)(local_188 + 0x10);
    local_194 = -1;
    iVar4 = getopt_long(local_198,local_190,local_118._M_dataplus._M_p,
                        (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl
                        .super__Vector_impl_data._M_start,&local_194);
    if (iVar4 < 0x3f) {
      iVar6 = 5;
      if (iVar4 != -1) {
        if (iVar4 != 0) {
LAB_00108950:
          local_188._8_8_ = (pointer)0x0;
          local_188[0x10] = '\0';
          if ((long)local_194 < 0) {
            local_e8 = (int)(char)iVar4;
            local_188._0_8_ = pp_Var7;
            std::
            map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator[]((map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_168,&local_e8);
            std::__cxx11::string::_M_assign((string *)local_188);
          }
          else {
            __s = (this->longopts).super__Vector_base<option,_std::allocator<option>_>._M_impl.
                  super__Vector_impl_data._M_start[local_194].name;
            local_188._0_8_ = pp_Var7;
            strlen(__s);
            std::__cxx11::string::_M_replace((ulong)local_188,0,(char *)0x0,(ulong)__s);
          }
          std::__cxx11::string::string((string *)&local_e8,_optarg,(allocator *)local_c8);
          std::__cxx11::string::string((string *)local_c8,_optarg,&local_199);
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_138.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          CLOptionsHelper::split((string *)local_c8,' ',&local_138);
          if ((_Base_ptr)local_c8._0_8_ != (_Base_ptr)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_48,&local_138);
          SetParam(this,(string *)local_188,&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_138);
          if ((undefined1 *)CONCAT44(uStack_e4,local_e8) != local_d8) {
            operator_delete((undefined1 *)CONCAT44(uStack_e4,local_e8));
          }
          if ((undefined1 *)local_188._0_8_ != local_188 + 0x10) {
            operator_delete((void *)local_188._0_8_);
          }
        }
        iVar6 = 0;
      }
    }
    else {
      if (iVar4 != 0x3f) {
        if (iVar4 == 0x68) {
          std::__cxx11::string::string((string *)local_188,*local_190,(allocator *)&local_e8);
          PrintHelp(this,(string *)local_188);
        }
        else {
          if (iVar4 != 0x76) goto LAB_00108950;
          pcVar1 = (this->version_opt).
                   super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .value._M_dataplus._M_p;
          this_00 = (CLOptions *)local_188;
          local_188._0_8_ = pp_Var7;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_188,pcVar1,
                     pcVar1 + (this->version_opt).
                              super_CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                              .value._M_string_length);
          PrintDescription(this_00,(string *)local_188,0);
        }
        if ((_func_int **)local_188._0_8_ != pp_Var7) {
          operator_delete((void *)local_188._0_8_);
        }
      }
      iVar6 = 1;
    }
    if (iVar6 != 0) {
      std::
      _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&local_168);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_118._M_dataplus._M_p != &local_118.field_2) {
        operator_delete(local_118._M_dataplus._M_p);
      }
      return iVar6 != 5;
    }
  } while( true );
}

Assistant:

bool CLOptions::ParseCommandLine(int argc, char** argv)
{
    // Establish the actual parameters
    DefineParams() ;

    // If we've defined a configuration file parameter, do a pre-loop to see if
    // the user has passed that parameter
    if (configfile_opt_name.size() > 0) {
        // Loop until we find the config file name
        bool use_default_configfile(true) ;
        while(1) {
            int c(0), options_index(-1) ;
            
            c = getopt_long_only(argc, argv, "",
                                 &longopts[0], &options_index) ;
            if (c==-1) break;
            if (c==0) continue ;
            if (std::string(longopts[options_index].name).compare(configfile_opt_name)==0) {
                if (FillFromFile(optarg)) return true ;
                use_default_configfile = false ;
                break ;
            }
        }
        // If the config file info wasnt filled AND if the default filename isnt empty
        // fill the config options from the default file
        if ((use_default_configfile)&&(!(*this)[configfile_opt_name].empty())) {
            if (FillFromFile((*this)[configfile_opt_name])) return true ;
        }
    }
    
    // Reset the option index so that we can start over filling the options
    // that were passed on the command line
    optind = 0 ;
    
    std::string short_opts ;
    std::map<int, std::string> short_to_long_map = GetShortOpts(short_opts) ;

    // Loop through all the passed options
    while (1)
    {
        int c(0) ;

        /* getopt_long stores the option index here. */
        int option_index = -1;
                
        // If short form options were given, then enforce the "double-dash" policy
        // for long options
        c = getopt_long (argc, argv, short_opts.c_str(),
                         &longopts[0], &option_index);
        
        /* Detect the end of the options. */
        if (c == -1) break;
        
        // Now loop through all of the options to fill them based on their values
        switch (c)
        {
            case 0:
                /* If this option set a flag, do nothing else now. */
                break;
            case 'h':
                // Print the help message and quit
                PrintHelp(argv[0]) ;
                return true ;
            case 'v':
                // Print the version information
                PrintDescription(version_opt.getValue(), 0) ;
                return true ;
            case '?':
                // getopt_long already printed an error message. This will
                // most typically happen when an unrecognized option has 
                // been passed, or when an option expecting an argument 
                // was not given one on the commandline.
                return true ;
            default:
                // We have found an option, so get the option name
                std::string opt_name ;
                if (option_index >= 0) {
                    // The long form of the name was supplied
                    opt_name = longopts[option_index].name ;
                } else {
                    // The short form of the name was supplied
                    char c_char(c) ;
                    opt_name = short_to_long_map[c_char] ;
                }
                std::string opt_val ( optarg ) ;
                std::vector<std::string> values = CLOptionsHelper::split( optarg, ' ') ;
                SetParam(opt_name, values) ;
                
                break ;
        }
    }
    // Note that it is up to the user to handle conflicts between parameters
    return false ;
}